

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_CheckSightOrRange
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  AActor *camera;
  PClass *pPVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 extraout_var;
  char *pcVar6;
  undefined8 *puVar7;
  long lVar8;
  AActor *self;
  bool bVar9;
  double range;
  PClass *pPVar5;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_003d6462;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003d6452:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d6462:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe06,
                  "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  self = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_003d62d2;
    pPVar5 = (self->super_DThinker).super_DObject.Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar3 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
      pPVar5 = (PClass *)CONCAT44(extraout_var,iVar3);
      (self->super_DThinker).super_DObject.Class = pPVar5;
    }
    bVar9 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar2 && bVar9) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar9 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar2) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (!bVar9) {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d6462;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_003d6452;
LAB_003d62d2:
    self = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar6 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\x01') {
      pVVar1 = param + 1;
      if (numparam < 3) {
        param = defaultparam->Array;
        if (param[2].field_0.field_3.Type == '\0') goto LAB_003d631e;
        pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[2].field_0.field_3.Type == '\0') {
LAB_003d631e:
          puVar7 = &DAT_017e1fb8;
          iVar3 = param[2].field_0.i;
          range = (pVVar1->field_0).f * (pVVar1->field_0).f;
          lVar8 = 0;
          do {
            if (playeringame[lVar8] == true) {
              bVar9 = DoCheckSightOrRange(self,(AActor *)puVar7[-0x2f],range,iVar3 != 0,true);
              if (bVar9) {
                if (numret < 1) goto LAB_003d6441;
                if (ret == (VMReturn *)0x0) {
                  __assert_fail("ret != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0xe12,
                                "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
LAB_003d63fe:
                if (ret->RegType != '\0') goto LAB_003d64a2;
                uVar4 = 0;
                goto LAB_003d640a;
              }
              camera = (AActor *)*puVar7;
              if (camera != (AActor *)0x0) {
                if (((camera->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
                  if ((camera->player == (player_t *)0x0) &&
                     (bVar9 = DoCheckSightOrRange(self,camera,range,iVar3 != 0,true), bVar9)) {
                    if (0 < numret) {
                      if (ret == (VMReturn *)0x0) {
                        __assert_fail("ret != NULL",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                      ,0xe18,
                                      "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                     );
                      }
                      goto LAB_003d63fe;
                    }
                    goto LAB_003d6441;
                  }
                }
                else {
                  *puVar7 = 0;
                }
              }
            }
            lVar8 = lVar8 + 1;
            puVar7 = puVar7 + 0x54;
          } while (lVar8 != 8);
          if (numret < 1) {
LAB_003d6441:
            iVar3 = 0;
          }
          else {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0xe1c,
                            "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            uVar4 = 1;
            if (ret->RegType != '\0') {
LAB_003d64a2:
              __assert_fail("RegType == REGT_INT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                            ,0x13f,"void VMReturn::SetInt(int)");
            }
LAB_003d640a:
            *(undefined4 *)ret->Location = uVar4;
            iVar3 = 1;
          }
          return iVar3;
        }
        pcVar6 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xe08,
                    "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar6 = "param[paramnum].Type == REGT_FLOAT";
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xe07,
                "int AF_AActor_CheckSightOrRange(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckSightOrRange)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(range);
	PARAM_BOOL_DEF(twodi);

	range *= range;
	for (int i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i])
		{
			// Always check from each player.
			if (DoCheckSightOrRange(self, players[i].mo, range, twodi, true))
			{
				ACTION_RETURN_BOOL(false);
			}
			// If a player is viewing from a non-player, check that too.
			if (players[i].camera != NULL && players[i].camera->player == NULL &&
				DoCheckSightOrRange(self, players[i].camera, range, twodi, true))
			{
				ACTION_RETURN_BOOL(false);
			}
		}
	}
	ACTION_RETURN_BOOL(true);
}